

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

TimingOf<std::chrono::_V2::steady_clock,_const_Catch::Benchmark::Detail::BenchmarkFunction_&,_run_for_at_least_argument_t<steady_clock,_const_BenchmarkFunction_&>_>
 Catch::Benchmark::Detail::
 run_for_at_least<std::chrono::_V2::steady_clock,Catch::Benchmark::Detail::BenchmarkFunction_const&>
           (ClockDuration<std::chrono::_V2::steady_clock> how_long,int seed,BenchmarkFunction *fun)

{
  _Head_base<0UL,_Catch::Benchmark::Detail::BenchmarkFunction::callable_*,_false> _Var1;
  ulong uVar2;
  TimingOf<std::chrono::_V2::steady_clock,_const_Catch::Benchmark::Detail::BenchmarkFunction_&,_run_for_at_least_argument_t<steady_clock,_const_BenchmarkFunction_&>_>
  TVar3;
  optimized_away_error local_48;
  long local_40;
  long lStack_38;
  
  do {
    if (0x3fffffff < seed) {
      local_48 = (optimized_away_error)&PTR__exception_001e0930;
      throw_exception<Catch::Benchmark::Detail::optimized_away_error>(&local_48);
    }
    uVar2 = (ulong)(uint)seed;
    local_48 = (optimized_away_error)&PTR_start_001e0958;
    local_40 = 0;
    lStack_38 = 0;
    _Var1._M_head_impl =
         (fun->f)._M_t.
         super___uniq_ptr_impl<Catch::Benchmark::Detail::BenchmarkFunction::callable,_std::default_delete<Catch::Benchmark::Detail::BenchmarkFunction::callable>_>
         ._M_t.
         super__Tuple_impl<0UL,_Catch::Benchmark::Detail::BenchmarkFunction::callable_*,_std::default_delete<Catch::Benchmark::Detail::BenchmarkFunction::callable>_>
         .super__Head_base<0UL,_Catch::Benchmark::Detail::BenchmarkFunction::callable_*,_false>.
         _M_head_impl;
    (**(_Var1._M_head_impl)->_vptr_callable)(_Var1._M_head_impl,&local_48,uVar2);
    TVar3.elapsed.__r = lStack_38 - local_40;
    seed = seed * 2;
  } while (TVar3.elapsed.__r < how_long.__r);
  TVar3._8_8_ = uVar2 << 0x20;
  return TVar3;
}

Assistant:

TimingOf<Clock, Fun, run_for_at_least_argument_t<Clock, Fun>> run_for_at_least(ClockDuration<Clock> how_long, int seed, Fun&& fun) {
                auto iters = seed;
                while (iters < (1 << 30)) {
                    auto&& Timing = measure_one<Clock>(fun, iters, is_callable<Fun(Chronometer)>());

                    if (Timing.elapsed >= how_long) {
                        return { Timing.elapsed, std::move(Timing.result), iters };
                    }
                    iters *= 2;
                }
                Catch::throw_exception(optimized_away_error{});
            }